

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kyber.cc
# Opt level: O2

void KYBER_decap(uint8_t *out_shared_secret,uint8_t *ciphertext,KYBER_private_key *private_key)

{
  uint16_t uVar1;
  int iVar2;
  byte *pbVar3;
  int j;
  size_t len;
  ulong uVar4;
  uint8_t *in;
  byte bVar5;
  long lVar6;
  uint16_t *out;
  int i;
  uint8_t decrypted [64];
  uint8_t prekey_and_randomness [64];
  uint8_t input [64];
  uint8_t expected_ciphertext [1088];
  
  pbVar3 = decrypted;
  vector_decode((vector *)expected_ciphertext,ciphertext,10);
  for (lVar6 = 0; lVar6 != 0x600; lVar6 = lVar6 + 0x200) {
    scalar_decompress((scalar *)(expected_ciphertext + lVar6),10);
  }
  vector_ntt((vector *)expected_ciphertext);
  out = (uint16_t *)prekey_and_randomness;
  scalar_decode((scalar *)out,ciphertext + 0x3c0,4);
  scalar_decompress((scalar *)out,4);
  scalar_inner_product
            ((scalar *)input,(vector *)((long)&private_key->opaque + 0x1840),
             (vector *)expected_ciphertext);
  scalar_inverse_ntt((scalar *)input);
  for (lVar6 = 0; lVar6 != 0x100; lVar6 = lVar6 + 1) {
    uVar1 = reduce_once((*(short *)(prekey_and_randomness + lVar6 * 2) -
                        *(short *)(input + lVar6 * 2)) + 0xd01);
    *(uint16_t *)(prekey_and_randomness + lVar6 * 2) = uVar1;
  }
  scalar_compress((scalar *)out,1);
  for (uVar4 = 0; uVar4 < 0x100; uVar4 = uVar4 + 8) {
    bVar5 = 0;
    for (lVar6 = 0; lVar6 != 8; lVar6 = lVar6 + 1) {
      bVar5 = bVar5 | (byte)((out[lVar6] & 1) << ((byte)lVar6 & 0x1f));
    }
    *pbVar3 = bVar5;
    pbVar3 = pbVar3 + 1;
    out = out + 8;
  }
  decrypted._32_8_ = *(undefined8 *)((long)&private_key->opaque + 0x620);
  decrypted._40_8_ = *(undefined8 *)((long)&private_key->opaque + 0x628);
  decrypted._48_8_ = *(undefined8 *)((long)&private_key->opaque + 0x630);
  decrypted._56_8_ = *(undefined8 *)((long)&private_key->opaque + 0x638);
  hash_g(prekey_and_randomness,decrypted,0x40);
  encrypt_cpa(expected_ciphertext,(public_key *)private_key,decrypted,prekey_and_randomness + 0x20);
  iVar2 = CRYPTO_memcmp(ciphertext,expected_ciphertext,0x440);
  len = 0;
  bVar5 = 0xff;
  if (iVar2 != 0) {
    bVar5 = 0;
  }
  for (; len != 0x20; len = len + 1) {
    input[len] = (private_key->opaque).bytes[len + 0x1e40] & ~bVar5 |
                 prekey_and_randomness[len] & bVar5;
  }
  hash_h(input + 0x20,ciphertext,0x440);
  kdf(out_shared_secret,(size_t)input,in,len);
  return;
}

Assistant:

void KYBER_decap(uint8_t out_shared_secret[KYBER_SHARED_SECRET_BYTES],
                 const uint8_t ciphertext[KYBER_CIPHERTEXT_BYTES],
                 const struct KYBER_private_key *private_key) {
  const struct private_key *priv = private_key_from_external(private_key);
  uint8_t decrypted[64];
  decrypt_cpa(decrypted, priv, ciphertext);
  OPENSSL_memcpy(decrypted + 32, priv->pub.public_key_hash,
                 sizeof(decrypted) - 32);
  uint8_t prekey_and_randomness[64];
  hash_g(prekey_and_randomness, decrypted, sizeof(decrypted));
  uint8_t expected_ciphertext[KYBER_CIPHERTEXT_BYTES];
  encrypt_cpa(expected_ciphertext, &priv->pub, decrypted,
              prekey_and_randomness + 32);
  uint8_t mask =
      constant_time_eq_int_8(CRYPTO_memcmp(ciphertext, expected_ciphertext,
                                           sizeof(expected_ciphertext)),
                             0);
  uint8_t input[64];
  for (int i = 0; i < 32; i++) {
    input[i] = constant_time_select_8(mask, prekey_and_randomness[i],
                                      priv->fo_failure_secret[i]);
  }
  hash_h(input + 32, ciphertext, KYBER_CIPHERTEXT_BYTES);
  kdf(out_shared_secret, KYBER_SHARED_SECRET_BYTES, input, sizeof(input));
}